

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O0

Result<wasm::Ok> * __thiscall
wasm::IRBuilder::makeBreak
          (Result<wasm::Ok> *__return_storage_ptr__,IRBuilder *this,Index label,bool isConditional)

{
  __index_type *__return_storage_ptr___00;
  Name name_00;
  Err *pEVar1;
  Name *pNVar2;
  Type *__t;
  Break *expr;
  bool bVar3;
  optional<wasm::Type> labelType_00;
  Expression *local_220;
  Ok local_1d9;
  uintptr_t local_1d8;
  size_t sStack_1d0;
  Err local_1c0;
  Err *local_1a0;
  Err *err_2;
  undefined1 local_190;
  undefined3 uStack_18f;
  ChildPopper local_188;
  undefined1 local_180 [8];
  Result<wasm::Ok> _val_2;
  Break curr;
  Err *err_1;
  Result<wasm::Type> _val_1;
  Result<wasm::Type> labelType;
  Err local_a8;
  Err *local_88;
  Err *err;
  undefined1 local_70 [8];
  Result<wasm::Name> _val;
  Result<wasm::Name> name;
  bool isConditional_local;
  Index label_local;
  IRBuilder *this_local;
  
  __return_storage_ptr___00 =
       (__index_type *)
       ((long)&_val.val.super__Variant_base<wasm::Name,_wasm::Err>.
               super__Move_assign_alias<wasm::Name,_wasm::Err>.
               super__Copy_assign_alias<wasm::Name,_wasm::Err>.
               super__Move_ctor_alias<wasm::Name,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Name,_wasm::Err> + 0x20);
  getLabelName((Result<wasm::Name> *)__return_storage_ptr___00,this,label,false);
  Result<wasm::Name>::Result
            ((Result<wasm::Name> *)local_70,(Result<wasm::Name> *)__return_storage_ptr___00);
  local_88 = Result<wasm::Name>::getErr((Result<wasm::Name> *)local_70);
  bVar3 = local_88 == (Err *)0x0;
  if (!bVar3) {
    wasm::Err::Err(&local_a8,local_88);
    Result<wasm::Ok>::Result(__return_storage_ptr__,&local_a8);
    wasm::Err::~Err(&local_a8);
  }
  Result<wasm::Name>::~Result((Result<wasm::Name> *)local_70);
  if (bVar3) {
    getLabelType((Result<wasm::Type> *)
                 ((long)&_val_1.val.super__Variant_base<wasm::Type,_wasm::Err>.
                         super__Move_assign_alias<wasm::Type,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20),this,label);
    Result<wasm::Type>::Result
              ((Result<wasm::Type> *)&err_1,
               (Result<wasm::Type> *)
               ((long)&_val_1.val.super__Variant_base<wasm::Type,_wasm::Err>.
                       super__Move_assign_alias<wasm::Type,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20));
    pEVar1 = Result<wasm::Type>::getErr((Result<wasm::Type> *)&err_1);
    if (pEVar1 != (Err *)0x0) {
      wasm::Err::Err((Err *)&curr.condition,pEVar1);
      Result<wasm::Ok>::Result(__return_storage_ptr__,(Err *)&curr.condition);
      wasm::Err::~Err((Err *)&curr.condition);
    }
    Result<wasm::Type>::~Result((Result<wasm::Type> *)&err_1);
    if (pEVar1 == (Err *)0x0) {
      Break::Break((Break *)((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                    super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                    super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                    super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
      pNVar2 = Result<wasm::Name>::operator*
                         ((Result<wasm::Name> *)
                          ((long)&_val.val.super__Variant_base<wasm::Name,_wasm::Err>.
                                  super__Move_assign_alias<wasm::Name,_wasm::Err>.
                                  super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                                  super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                                  super__Copy_ctor_alias<wasm::Name,_wasm::Err> + 0x20));
      wasm::Name::operator=
                ((Name *)&curr.super_SpecificExpression<(wasm::Expression::Id)4>.super_Expression.
                          type,pNVar2);
      if (isConditional) {
        local_220 = (Expression *)
                    ((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20);
      }
      else {
        local_220 = (Expression *)0x0;
      }
      curr.value = local_220;
      ChildPopper::ChildPopper(&local_188,this);
      __t = Result<wasm::Type>::operator*
                      ((Result<wasm::Type> *)
                       ((long)&_val_1.val.super__Variant_base<wasm::Type,_wasm::Err>.
                               super__Move_assign_alias<wasm::Type,_wasm::Err>.
                               super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                               super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20));
      std::optional<wasm::Type>::optional<wasm::Type_&,_true>((optional<wasm::Type> *)&err_2,__t);
      labelType_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._12_4_ = 0;
      labelType_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)err_2;
      labelType_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_engaged = (bool)local_190;
      labelType_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._9_3_ = uStack_18f;
      ChildPopper::visitBreak
                ((Result<wasm::Ok> *)local_180,&local_188,
                 (Break *)((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                  super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                  super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                  super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),labelType_00);
      local_1a0 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)local_180);
      bVar3 = local_1a0 == (Err *)0x0;
      if (!bVar3) {
        wasm::Err::Err(&local_1c0,local_1a0);
        Result<wasm::Ok>::Result(__return_storage_ptr__,&local_1c0);
        wasm::Err::~Err(&local_1c0);
      }
      Result<wasm::Ok>::~Result((Result<wasm::Ok> *)local_180);
      if (bVar3) {
        local_1d8 = curr.super_SpecificExpression<(wasm::Expression::Id)4>.super_Expression.type.id;
        sStack_1d0 = curr.name.super_IString.str._M_len;
        name_00.super_IString.str._M_str = (char *)curr.name.super_IString.str._M_len;
        name_00.super_IString.str._M_len =
             curr.super_SpecificExpression<(wasm::Expression::Id)4>.super_Expression.type.id;
        expr = Builder::makeBreak(&this->builder,name_00,
                                  (Expression *)curr.name.super_IString.str._M_str,curr.value);
        push(this,(Expression *)expr);
        Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_1d9);
      }
    }
    Result<wasm::Type>::~Result
              ((Result<wasm::Type> *)
               ((long)&_val_1.val.super__Variant_base<wasm::Type,_wasm::Err>.
                       super__Move_assign_alias<wasm::Type,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20));
  }
  Result<wasm::Name>::~Result
            ((Result<wasm::Name> *)
             ((long)&_val.val.super__Variant_base<wasm::Name,_wasm::Err>.
                     super__Move_assign_alias<wasm::Name,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Name,_wasm::Err> + 0x20));
  return __return_storage_ptr__;
}

Assistant:

Result<> IRBuilder::makeBreak(Index label, bool isConditional) {
  auto name = getLabelName(label);
  CHECK_ERR(name);
  auto labelType = getLabelType(label);
  CHECK_ERR(labelType);

  Break curr;
  curr.name = *name;
  // Use a dummy condition value if we need to pop a condition.
  curr.condition = isConditional ? &curr : nullptr;
  CHECK_ERR(ChildPopper{*this}.visitBreak(&curr, *labelType));
  push(builder.makeBreak(curr.name, curr.value, curr.condition));
  return Ok{};
}